

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

int spki_table_search_by_ski
              (spki_table *spki_table,uint8_t *ski,spki_record **result,uint *result_size)

{
  long lVar1;
  undefined8 *__s1;
  undefined8 uVar2;
  int iVar3;
  spki_record *psVar4;
  uint uVar5;
  long lVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  tommy_list ptVar9;
  long in_FS_OFFSET;
  byte bVar10;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *result = (spki_record *)0x0;
  *result_size = 0;
  pthread_rwlock_rdlock((pthread_rwlock_t *)&spki_table->lock);
  ptVar9 = (tommy_list)&spki_table->list;
  do {
    do {
      ptVar9 = ptVar9->next;
      if (ptVar9 == (tommy_list)0x0) {
        iVar3 = 0;
LAB_0010bd5c:
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
        return iVar3;
      }
      __s1 = (undefined8 *)ptVar9->data;
      iVar3 = bcmp(__s1,ski,0x14);
    } while (iVar3 != 0);
    uVar5 = *result_size;
    *result_size = uVar5 + 1;
    psVar4 = (spki_record *)lrtr_realloc(*result,(ulong)(uVar5 + 1) << 7);
    if (psVar4 == (spki_record *)0x0) {
      lrtr_free(*result);
      iVar3 = -1;
      goto LAB_0010bd5c;
    }
    *result = psVar4;
    uVar5 = *result_size - 1;
    psVar4[uVar5].asn = *(uint32_t *)((long)__s1 + 0x14);
    psVar4[uVar5].socket = (rtr_socket *)__s1[0xf];
    uVar2 = __s1[1];
    *(undefined8 *)psVar4[uVar5].ski = *__s1;
    *(undefined8 *)(psVar4[uVar5].ski + 8) = uVar2;
    *(undefined4 *)(psVar4[uVar5].ski + 0x10) = *(undefined4 *)(__s1 + 2);
    puVar7 = (uint8_t *)(__s1 + 3);
    puVar8 = psVar4[uVar5].spki;
    for (lVar6 = 0x5b; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
  } while( true );
}

Assistant:

int spki_table_search_by_ski(struct spki_table *spki_table, uint8_t *ski, struct spki_record **result,
			     unsigned int *result_size)
{
	tommy_node *current_node;
	void *tmp;
	*result = NULL;
	*result_size = 0;

	pthread_rwlock_rdlock(&spki_table->lock);

	current_node = tommy_list_head(&spki_table->list);
	while (current_node) {
		struct key_entry *current_entry;

		current_entry = (struct key_entry *)current_node->data;

		if (memcmp(current_entry->ski, ski, sizeof(current_entry->ski)) == 0) {
			(*result_size)++;
			tmp = lrtr_realloc(*result, sizeof(**result) * (*result_size));
			if (!tmp) {
				lrtr_free(*result);
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			*result = tmp;
			key_entry_to_spki_record(current_entry, *result + (*result_size - 1));
		}
		current_node = current_node->next;
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}